

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-finder.hpp
# Opt level: O0

void __thiscall
yactfr::internal::PseudoDtFinder<yactfr::internal::PseudoDtVisitor>::visit
          (PseudoDtFinder<yactfr::internal::PseudoDtVisitor> *this,
          _tPseudoDt<PseudoStructType> *pseudoDt)

{
  bool bVar1;
  PseudoNamedDts *this_00;
  reference this_01;
  pointer pPVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar3
  ;
  reference_const_type pbVar4;
  PseudoDt *pPVar5;
  unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
  *pseudoMemberType;
  iterator __end0;
  iterator __begin0;
  PseudoNamedDts *__range3;
  _tPseudoDt<PseudoStructType> *pseudoDt_local;
  PseudoDtFinder<yactfr::internal::PseudoDtVisitor> *this_local;
  
  _tryAdd(this,&pseudoDt->super_PseudoDt);
  this_00 = PseudoStructType::pseudoMemberTypes(pseudoDt);
  __end0 = std::
           vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
           ::begin(this_00);
  pseudoMemberType =
       (unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
        *)std::
          vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_*,_std::vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>_>
                                *)&pseudoMemberType);
    if (!bVar1) {
      return;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_*,_std::vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>_>
              ::operator*(&__end0);
    pPVar2 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->(this_01);
    poVar3 = PseudoNamedDt::name_abi_cxx11_(pPVar2);
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!(poVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pPVar2 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->(this_01);
    poVar3 = PseudoNamedDt::name_abi_cxx11_(pPVar2);
    pbVar4 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(poVar3);
    this->_curMemberTypeName = pbVar4;
    pPVar2 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->(this_01);
    pPVar5 = PseudoNamedDt::pseudoDt(pPVar2);
    (*pPVar5->_vptr_PseudoDt[4])(pPVar5,this);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_*,_std::vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>_>
    ::operator++(&__end0);
  }
  __assert_fail("pseudoMemberType->name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/../pseudo-dt-finder.hpp"
                ,0x4d,
                "virtual void yactfr::internal::PseudoDtFinder<yactfr::internal::PseudoDtVisitor>::visit(_tPseudoDt<PseudoStructType> &) [ParentVisitorT = yactfr::internal::PseudoDtVisitor]"
               );
}

Assistant:

void visit(_tPseudoDt<PseudoStructType>& pseudoDt) override
    {
        this->_tryAdd(pseudoDt);

        for (const auto& pseudoMemberType : pseudoDt.pseudoMemberTypes()) {
            assert(pseudoMemberType->name());
            _curMemberTypeName = &(*pseudoMemberType->name());
            pseudoMemberType->pseudoDt().accept(*this);
        }
    }